

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labeling_he_2008.h
# Opt level: O2

double __thiscall RBTS<RemSP>::Alloc(RBTS<RemSP> *this)

{
  PerformanceEvaluator *perf;
  undefined8 uVar1;
  double dVar2;
  double dVar3;
  Mat1b *pMVar4;
  Mat1i *pMVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  size_t capacity;
  double dVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  Size local_88;
  Mat local_80 [96];
  
  pMVar4 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
  perf = &(this->super_Labeling2D<(Connectivity2D)8,_false>).super_Labeling.perf_;
  dVar10 = RemSP::Alloc(((*(int *)&pMVar4->field_0x8 + 1) / 2) *
                        ((*(int *)&pMVar4->field_0xc + 1) / 2) + 1,perf);
  PerformanceEvaluator::start(perf);
  uVar1 = **(undefined8 **)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->field_0x40;
  local_88.height = (int)uVar1;
  local_88.width = (int)((ulong)uVar1 >> 0x20);
  cv::Mat_<int>::Mat_((Mat_<int> *)local_80,&local_88);
  cv::Mat::operator=(&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->super_Mat,
                     local_80);
  cv::Mat::~Mat(local_80);
  pMVar5 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_;
  memset(*(void **)&pMVar5->field_0x10,0,*(long *)&pMVar5->field_0x20 - *(long *)&pMVar5->field_0x18
        );
  PerformanceEvaluator::stop(perf);
  dVar6 = (this->super_Labeling2D<(Connectivity2D)8,_false>).super_Labeling.perf_.tick_frequency_;
  dVar7 = (this->super_Labeling2D<(Connectivity2D)8,_false>).super_Labeling.perf_.counter_.last;
  PerformanceEvaluator::start(perf);
  pMVar5 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_;
  memset(*(void **)&pMVar5->field_0x10,0,*(long *)&pMVar5->field_0x20 - *(long *)&pMVar5->field_0x18
        );
  PerformanceEvaluator::stop(perf);
  dVar8 = (this->super_Labeling2D<(Connectivity2D)8,_false>).super_Labeling.perf_.tick_frequency_;
  dVar9 = (this->super_Labeling2D<(Connectivity2D)8,_false>).super_Labeling.perf_.counter_.last;
  PerformanceEvaluator::start(perf);
  capacity = (size_t)(*(int *)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->field_0xc
                      / 2 + 2);
  CircularBuffer<int>::Create(&this->s_queue_,capacity);
  CircularBuffer<int>::Create(&this->e_queue_,capacity);
  memset((this->s_queue_).buffer_,0,capacity);
  memset((this->e_queue_).buffer_,0,capacity);
  PerformanceEvaluator::stop(perf);
  dVar2 = (this->super_Labeling2D<(Connectivity2D)8,_false>).super_Labeling.perf_.counter_.last;
  dVar3 = (this->super_Labeling2D<(Connectivity2D)8,_false>).super_Labeling.perf_.tick_frequency_;
  PerformanceEvaluator::start(perf);
  memset((this->s_queue_).buffer_,0,capacity);
  memset((this->e_queue_).buffer_,0,capacity);
  PerformanceEvaluator::stop(perf);
  auVar11._0_8_ = dVar7 * 1000.0;
  auVar11._8_8_ = dVar2 * 1000.0;
  auVar12._8_8_ = dVar3;
  auVar12._0_8_ = dVar6;
  auVar12 = divpd(auVar11,auVar12);
  auVar13._0_8_ = dVar9 * 1000.0;
  auVar13._8_8_ =
       (this->super_Labeling2D<(Connectivity2D)8,_false>).super_Labeling.perf_.counter_.last *
       1000.0;
  auVar14._8_8_ =
       (this->super_Labeling2D<(Connectivity2D)8,_false>).super_Labeling.perf_.tick_frequency_;
  auVar14._0_8_ = dVar8;
  auVar14 = divpd(auVar13,auVar14);
  return (auVar12._8_8_ - auVar14._8_8_) + dVar10 + (auVar12._0_8_ - auVar14._0_8_);
}

Assistant:

double Alloc()
    {
        // Memory allocation of the labels solver
        double ls_t = LabelsSolver::Alloc(UPPER_BOUND_8_CONNECTIVITY, perf_);
        // Memory allocation for the output image
        perf_.start();
        img_labels_ = cv::Mat1i(img_.size());
        memset(img_labels_.data, 0, img_labels_.dataend - img_labels_.datastart);
        perf_.stop();
        double t = perf_.last();
        perf_.start();
        memset(img_labels_.data, 0, img_labels_.dataend - img_labels_.datastart);
        perf_.stop();
        double ma_t = t - perf_.last();

        perf_.start();
        int w(img_.cols); // w = N in the paper naming convention
        // Circular Buffers
        int buffer_capacity = w / 2 + 2;
        s_queue_.Create(buffer_capacity);
        e_queue_.Create(buffer_capacity);
        memset(s_queue_.buffer_, 0, buffer_capacity);
        memset(e_queue_.buffer_, 0, buffer_capacity);
        perf_.stop();
        double qu_t = perf_.last();
        perf_.start();
        memset(s_queue_.buffer_, 0, buffer_capacity);
        memset(e_queue_.buffer_, 0, buffer_capacity);
        perf_.stop();
        qu_t -= perf_.last();

        // Return total time
        return ls_t + ma_t + qu_t;
    }